

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTCue_Pause(FACTCue *pCue,int32_t fPause)

{
  FACTWave *pWave;
  uint32_t uVar1;
  FACTSoundInstance *pFVar2;
  long lVar3;
  ulong uVar4;
  
  if (pCue == (FACTCue *)0x0) {
    return 1;
  }
  FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
  if ((pCue->state & 0x30) == 0) {
    uVar1 = FAudio_timems();
    pCue->elapsed = pCue->elapsed + (uVar1 - pCue->start);
    pCue->state = (uint)(fPause != 0) << 6 | pCue->state & 0xffffffbf;
    if (pCue->simpleWave == (FACTWave *)0x0) {
      if ((pCue->playingSound != (FACTSoundInstance *)0x0) &&
         (pFVar2 = pCue->playingSound, pFVar2->sound->trackCount != '\0')) {
        lVar3 = 0x28;
        uVar4 = 0;
        do {
          pWave = *(FACTWave **)((long)&pFVar2->tracks->events + lVar3);
          if (pWave != (FACTWave *)0x0) {
            FACTWave_Pause(pWave,fPause);
          }
          uVar4 = uVar4 + 1;
          pFVar2 = pCue->playingSound;
          lVar3 = lVar3 + 0x68;
        } while (uVar4 < pFVar2->sound->trackCount);
      }
    }
    else {
      FACTWave_Pause(pCue->simpleWave,fPause);
    }
  }
  FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
  return 0;
}

Assistant:

uint32_t FACTCue_Pause(FACTCue *pCue, int32_t fPause)
{
	uint8_t i;
	if (pCue == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	/* "A stopping or stopped cue cannot be paused." */
	if (pCue->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))
	{
		FAudio_PlatformUnlockMutex(
			pCue->parentBank->parentEngine->apiLock
		);
		return 0;
	}

	/* Store elapsed time */
	pCue->elapsed += FAudio_timems() - pCue->start;

	/* All we do is set the flag, not much to see here */
	if (fPause)
	{
		pCue->state |= FACT_STATE_PAUSED;
	}
	else
	{
		pCue->state &= ~FACT_STATE_PAUSED;
	}

	/* Pause the Waves */
	if (pCue->simpleWave != NULL)
	{
		FACTWave_Pause(pCue->simpleWave, fPause);
	}
	else if (pCue->playingSound != NULL)
	{
		for (i = 0; i < pCue->playingSound->sound->trackCount; i += 1)
		{
			if (pCue->playingSound->tracks[i].activeWave.wave != NULL)
			{
				FACTWave_Pause(
					pCue->playingSound->tracks[i].activeWave.wave,
					fPause
				);
			}
		}
	}

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}